

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calculateEdgeLogLikelihoodsByPartition
          (BeagleCPUImpl<float,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *firstDerivativeIndices,int *secondDerivativeIndices,
          int *categoryWeightsIndices,int *stateFrequenciesIndices,int *cumulativeScaleIndices,
          int *partitionIndices,int partitionCount,int count,double *outSumLogLikelihoodByPartition,
          double *outSumLogLikelihood,double *outSumFirstDerivativeByPartition,
          double *outSumFirstDerivative,double *outSumSecondDerivativeByPartition,
          double *outSumSecondDerivative)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  long in_R8;
  long in_R9;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  int in_stack_00000028;
  int in_stack_00000030;
  long in_stack_00000038;
  double *in_stack_00000040;
  long in_stack_00000048;
  double *in_stack_00000050;
  int i_1;
  int i;
  int returnCode;
  int local_74;
  int local_70;
  int local_6c;
  
  local_6c = 0;
  if (in_stack_00000030 == 1) {
    if ((in_RDI[0xb] & 0x80U) == 0) {
      if ((in_RDI[0xb] & 0x100U) == 0) {
        if ((in_R8 == 0) && (in_R9 == 0)) {
          if ((*(byte *)((long)in_RDI + 0x134) & 1) == 0) {
            (**(code **)(*in_RDI + 0x278))
                      (in_RDI,in_RSI,in_RDX,in_RCX,in_stack_00000008,in_stack_00000010);
          }
          else {
            (**(code **)(*in_RDI + 0x268))
                      (in_RDI,in_RSI,in_RDX,in_RCX,in_stack_00000008,in_stack_00000010);
          }
        }
        else {
          if (in_R9 == 0) {
            return -7;
          }
          (**(code **)(*in_RDI + 0x280))(in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_R9);
          *in_stack_00000050 = 0.0;
          secondDerivativeIndices[0] = 0;
          secondDerivativeIndices[1] = 0;
          for (local_70 = 0; local_70 < in_stack_00000028; local_70 = local_70 + 1) {
            *in_stack_00000050 =
                 *(double *)(in_stack_00000048 + (long)local_70 * 8) + *in_stack_00000050;
            *(double *)secondDerivativeIndices =
                 *(double *)(_i + (long)local_70 * 8) + *(double *)secondDerivativeIndices;
          }
          if ((((*in_stack_00000050 != *in_stack_00000050) ||
               (NAN(*in_stack_00000050) || NAN(*in_stack_00000050))) ||
              (*(double *)secondDerivativeIndices != *(double *)secondDerivativeIndices)) ||
             (NAN(*(double *)secondDerivativeIndices) || NAN(*(double *)secondDerivativeIndices))) {
            local_6c = -8;
          }
        }
        *in_stack_00000040 = 0.0;
        for (local_74 = 0; local_74 < in_stack_00000028; local_74 = local_74 + 1) {
          *in_stack_00000040 =
               *(double *)(in_stack_00000038 + (long)local_74 * 8) + *in_stack_00000040;
        }
        if ((*in_stack_00000040 != *in_stack_00000040) ||
           (NAN(*in_stack_00000040) || NAN(*in_stack_00000040))) {
          local_6c = -8;
        }
      }
      else {
        local_6c = -7;
      }
    }
    else {
      local_6c = -7;
    }
  }
  else {
    local_6c = -7;
  }
  return local_6c;
}

Assistant:

BEAGLE_CPU_TEMPLATE
    int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calculateEdgeLogLikelihoodsByPartition(
                                                    const int* parentBufferIndices,
                                                    const int* childBufferIndices,
                                                    const int* probabilityIndices,
                                                    const int* firstDerivativeIndices,
                                                    const int* secondDerivativeIndices,
                                                    const int* categoryWeightsIndices,
                                                    const int* stateFrequenciesIndices,
                                                    const int* cumulativeScaleIndices,
                                                    const int* partitionIndices,
                                                    int partitionCount,
                                                    int count,
                                                    double* outSumLogLikelihoodByPartition,
                                                    double* outSumLogLikelihood,
                                                    double* outSumFirstDerivativeByPartition,
                                                    double* outSumFirstDerivative,
                                                    double* outSumSecondDerivativeByPartition,
                                                    double* outSumSecondDerivative) {

    int returnCode = BEAGLE_SUCCESS;

    if (count == 1) {
        if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
            returnCode =  BEAGLE_ERROR_NO_IMPLEMENTATION;
        } else if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
            returnCode = BEAGLE_ERROR_NO_IMPLEMENTATION;
        } else {

            if (firstDerivativeIndices == NULL && secondDerivativeIndices == NULL) {

                if (kThreadingEnabled) {
                    calcEdgeLogLikelihoodsByPartitionAsync(parentBufferIndices,
                                                           childBufferIndices,
                                                           probabilityIndices,
                                                           categoryWeightsIndices,
                                                           stateFrequenciesIndices,
                                                           cumulativeScaleIndices,
                                                           partitionIndices,
                                                           partitionCount,
                                                           outSumLogLikelihoodByPartition);
                } else {
                    calcEdgeLogLikelihoodsByPartition(parentBufferIndices,
                                                      childBufferIndices,
                                                      probabilityIndices,
                                                      categoryWeightsIndices,
                                                      stateFrequenciesIndices,
                                                      cumulativeScaleIndices,
                                                      partitionIndices,
                                                      partitionCount,
                                                      outSumLogLikelihoodByPartition);
                }


            } else if (secondDerivativeIndices == NULL) {
                return BEAGLE_ERROR_NO_IMPLEMENTATION;
            } else {

                calcEdgeLogLikelihoodsSecondDerivByPartition(
                                                parentBufferIndices,
                                                childBufferIndices,
                                                probabilityIndices,
                                                firstDerivativeIndices,
                                                secondDerivativeIndices,
                                                categoryWeightsIndices,
                                                stateFrequenciesIndices,
                                                cumulativeScaleIndices,
                                                partitionIndices,
                                                partitionCount,
                                                outSumLogLikelihoodByPartition,
                                                outSumFirstDerivativeByPartition,
                                                outSumSecondDerivativeByPartition);

                *outSumFirstDerivative  = 0.0;
                *outSumSecondDerivative = 0.0;

                for (int i = 0; i < partitionCount; i++) {
                    *outSumFirstDerivative  += outSumFirstDerivativeByPartition[i];
                    *outSumSecondDerivative += outSumSecondDerivativeByPartition[i];
                }

                if (*outSumFirstDerivative  != *outSumFirstDerivative ||
                    *outSumSecondDerivative != *outSumSecondDerivative) {
                    returnCode = BEAGLE_ERROR_FLOATING_POINT;
                }
            }

            *outSumLogLikelihood = 0.0;

            for (int i = 0; i < partitionCount; i++) {
                *outSumLogLikelihood += outSumLogLikelihoodByPartition[i];
            }

            if (*outSumLogLikelihood != *outSumLogLikelihood) {
                returnCode = BEAGLE_ERROR_FLOATING_POINT;
            }

        }
    } else {
        returnCode = BEAGLE_ERROR_NO_IMPLEMENTATION;
    }

    return returnCode;
}